

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::Pubkey::GetFingerprint(ByteData *__return_storage_ptr__,Pubkey *this,uint32_t get_size)

{
  bool bVar1;
  CfdException *this_00;
  uchar *buffer;
  undefined1 local_d0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  ByteData160 data160;
  undefined1 local_88 [8];
  ByteData data;
  allocator local_59;
  string local_58;
  CfdSourceLocation local_38;
  uint32_t local_1c;
  Pubkey *pPStack_18;
  uint32_t get_size_local;
  Pubkey *this_local;
  
  local_1c = get_size;
  pPStack_18 = this;
  this_local = (Pubkey *)__return_storage_ptr__;
  if ((get_size != 0) && (get_size < 0x15)) {
    ByteData::ByteData((ByteData *)local_88);
    bVar1 = IsCompress(this);
    if (bVar1) {
      ByteData::operator=((ByteData *)local_88,&this->data_);
    }
    else {
      Compress((Pubkey *)
               &data160.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,this);
      ByteData::operator=((ByteData *)local_88,
                          (ByteData *)
                          &data160.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      ~Pubkey((Pubkey *)
              &data160.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    HashUtil::Hash160((ByteData160 *)
                      &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData *)local_88);
    ByteData160::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,
               (ByteData160 *)
               &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    buffer = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
    ByteData::ByteData(__return_storage_ptr__,buffer,local_1c);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
    ByteData160::~ByteData160
              ((ByteData160 *)
               &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ByteData::~ByteData((ByteData *)local_88);
    return __return_storage_ptr__;
  }
  local_38.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_key.cpp"
               ,0x2f);
  local_38.filename = local_38.filename + 1;
  local_38.line = 0x51;
  local_38.funcname = "GetFingerprint";
  logger::warn<unsigned_int&>(&local_38,"Invalid fingerprint size: {}.",&local_1c);
  data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_58,"Invalid fingerprint size.",&local_59);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_58);
  data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData Pubkey::GetFingerprint(uint32_t get_size) const {
  if ((get_size == 0) || (get_size > kByteData160Length)) {
    warn(CFD_LOG_SOURCE, "Invalid fingerprint size: {}.", get_size);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid fingerprint size.");
  }

  ByteData data;
  if (IsCompress()) {
    data = data_;
  } else {
    data = Compress().data_;
  }
  auto data160 = HashUtil::Hash160(data);
  auto bytes = data160.GetBytes();
  return ByteData(bytes.data(), get_size);
}